

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclibprs.cpp
# Opt level: O0

void __thiscall CTcLibParser::scan_resource(CTcLibParser *this,char *val)

{
  char *in_RSI;
  long *in_RDI;
  char full_name [4096];
  char rel_path [4096];
  char *in_stack_ffffffffffffdfd8;
  size_t in_stack_ffffffffffffdfe8;
  char *in_stack_ffffffffffffdff0;
  char local_1018 [4104];
  char *local_10;
  
  local_10 = in_RSI;
  os_cvt_url_dir(local_1018,0x1000,in_RSI);
  os_build_full_path(in_stack_ffffffffffffdff0,in_stack_ffffffffffffdfe8,(char *)in_RDI,
                     in_stack_ffffffffffffdfd8);
  (**(code **)(*in_RDI + 0x78))(in_RDI,local_10,&stack0xffffffffffffdfe8);
  return;
}

Assistant:

void CTcLibParser::scan_resource(const char *val)
{
    char rel_path[OSFNMAX];
    char full_name[OSFNMAX];

    /* convert the value from a URL-style path to a local path */
    os_cvt_url_dir(rel_path, sizeof(rel_path), val);

    /* build the full name */
    os_build_full_path(full_name, sizeof(full_name), lib_path_, rel_path);

    /* call the full resource filename scanner */
    scan_full_resource(val, full_name);
}